

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DefaultFBOMultisampleCase::readImage
          (DefaultFBOMultisampleCase *this,Surface *dst)

{
  int x;
  int y;
  RenderContext *context;
  PixelBufferAccess local_40;
  Surface *local_18;
  Surface *dst_local;
  DefaultFBOMultisampleCase *this_local;
  
  local_18 = dst;
  dst_local = (Surface *)this;
  context = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  x = this->m_viewportX;
  y = this->m_viewportY;
  tcu::Surface::getAccess(&local_40,local_18);
  glu::readPixels(context,x,y,&local_40);
  return;
}

Assistant:

void DefaultFBOMultisampleCase::readImage (tcu::Surface& dst) const
{
	glu::readPixels(m_context.getRenderContext(), m_viewportX, m_viewportY, dst.getAccess());
}